

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hybi13.hpp
# Opt level: O0

error_code __thiscall
websocketpp::processor::hybi13<websocketpp::config::asio>::prepare_close
          (hybi13<websocketpp::config::asio> *this,value code,string *reason,message_ptr *out)

{
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last;
  undefined1 uVar1;
  bool bVar2;
  long lVar3;
  ulong uVar4;
  undefined1 *puVar5;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  value in_SI;
  error_code eVar6;
  message_ptr *in_stack_00000008;
  string *in_stack_00000010;
  value in_stack_0000001c;
  hybi13<websocketpp::config::asio> *in_stack_00000020;
  code_converter val;
  string payload;
  shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>
  *in_stack_ffffffffffffff08;
  difference_type in_stack_ffffffffffffff10;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffff18;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff28;
  undefined7 in_stack_ffffffffffffff30;
  char cVar7;
  shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>
  local_a0;
  char *local_90;
  undefined8 local_88;
  char *local_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined2 local_52;
  string local_50 [54];
  value local_1a;
  uint local_10;
  error_category *local_8;
  
  local_1a = in_SI;
  bVar2 = close::status::reserved(in_SI);
  if (bVar2) {
    eVar6 = error::make_error_code(0);
    local_8 = eVar6._M_cat;
    local_10 = eVar6._M_value;
  }
  else {
    bVar2 = close::status::invalid(local_1a);
    if ((bVar2) && (local_1a != 0x3ed)) {
      eVar6 = error::make_error_code(0);
      local_8 = eVar6._M_cat;
      local_10 = eVar6._M_value;
    }
    else if ((local_1a == 0x3ed) && (lVar3 = std::__cxx11::string::size(), lVar3 != 0)) {
      eVar6 = error::make_error_code(0);
      local_8 = eVar6._M_cat;
      local_10 = eVar6._M_value;
    }
    else {
      uVar4 = std::__cxx11::string::size();
      if (uVar4 < 0x7c) {
        std::__cxx11::string::string(local_50);
        if (local_1a != 0x3ed) {
          local_52 = htons(local_1a);
          std::__cxx11::string::size();
          std::__cxx11::string::resize((ulong)local_50);
          uVar1 = (undefined1)local_52;
          puVar5 = (undefined1 *)std::__cxx11::string::operator[]((ulong)local_50);
          *puVar5 = uVar1;
          cVar7 = local_52._1_1_;
          __first._M_current = (char *)std::__cxx11::string::operator[]((ulong)local_50);
          *__first._M_current = cVar7;
          local_70 = std::__cxx11::string::begin();
          local_78 = std::__cxx11::string::end();
          local_88 = std::__cxx11::string::begin();
          local_80 = (char *)__gnu_cxx::
                             __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             ::operator+(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
          __last._M_current._7_1_ = cVar7;
          __last._M_current._0_7_ = in_stack_ffffffffffffff30;
          local_90 = (char *)std::
                             copy<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                                       (__first,__last,in_stack_ffffffffffffff28);
        }
        std::
        shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>
        ::shared_ptr(&local_a0,in_stack_ffffffffffffff08);
        eVar6 = prepare_control(in_stack_00000020,in_stack_0000001c,in_stack_00000010,
                                in_stack_00000008);
        local_8 = eVar6._M_cat;
        local_10 = eVar6._M_value;
        std::
        shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>
        ::~shared_ptr((shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>
                       *)0x32f4e6);
        std::__cxx11::string::~string(local_50);
      }
      else {
        eVar6 = error::make_error_code(0);
        local_8 = eVar6._M_cat;
        local_10 = eVar6._M_value;
      }
    }
  }
  eVar6._4_4_ = 0;
  eVar6._M_value = local_10;
  eVar6._M_cat = local_8;
  return eVar6;
}

Assistant:

virtual lib::error_code prepare_close(close::status::value code,
        std::string const & reason, message_ptr out) const
    {
        if (close::status::reserved(code)) {
            return make_error_code(error::reserved_close_code);
        }

        if (close::status::invalid(code) && code != close::status::no_status) {
            return make_error_code(error::invalid_close_code);
        }

        if (code == close::status::no_status && reason.size() > 0) {
            return make_error_code(error::reason_requires_code);
        }

        if (reason.size() > frame:: limits::payload_size_basic-2) {
            return make_error_code(error::control_too_big);
        }

        std::string payload;

        if (code != close::status::no_status) {
            close::code_converter val;
            val.i = htons(code);

            payload.resize(reason.size()+2);

            payload[0] = val.c[0];
            payload[1] = val.c[1];

            std::copy(reason.begin(),reason.end(),payload.begin()+2);
        }

        return this->prepare_control(frame::opcode::CLOSE,payload,out);
    }